

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_module.cpp
# Opt level: O2

ModBody * __thiscall
pfederc::Parser::parseModBody(ModBody *__return_storage_ptr__,Parser *this,bool isprog)

{
  _Alloc_hider _Var1;
  bool bVar2;
  pointer pEVar3;
  undefined7 in_register_00000011;
  pointer pEVar4;
  __normal_iterator<const_pfederc::TokenType_*,_std::vector<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>_>
  __it;
  char cVar5;
  ulong uVar6;
  ExprType EVar7;
  long lVar8;
  long lVar9;
  vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
  *this_00;
  __normal_iterator<const_pfederc::TokenType_*,_std::vector<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>_>
  _Var10;
  Parser *pPVar11;
  bool err;
  undefined1 local_e6 [6];
  undefined1 local_e0 [8];
  undefined1 local_d8 [24];
  Token *progName;
  Token *tok;
  Token *local_b0;
  Token *local_a8;
  _Alloc_hider local_a0;
  Exprs defs;
  Exprs imports;
  undefined1 local_48 [16];
  
  local_e6._2_4_ = (undefined4)CONCAT71(in_register_00000011,isprog);
  uVar6 = CONCAT71(in_register_00000011,isprog) & 0xffffffff;
  progName = (Token *)0x0;
  imports.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imports.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  imports.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  defs.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  defs.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  defs.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  err = false;
  local_e0[7] = (byte)uVar6 ^ 1;
  local_b0 = (Token *)&PTR__BiOpExpr_00128998;
  local_a8 = (Token *)&PTR__TokenExpr_00128768;
  local_a0._M_p = (pointer)__return_storage_ptr__;
LAB_00114dd7:
  while( true ) {
    cVar5 = (char)uVar6;
    bVar2 = Token::operator!=(this->lexer->currentToken,TOK_EOL);
    if (!bVar2) break;
    while( true ) {
      bVar2 = Token::operator==(this->lexer->currentToken,TOK_EOL);
      if (!bVar2) break;
      Lexer::next(this->lexer);
    }
    bVar2 = Token::operator==(this->lexer->currentToken,TOK_EOF);
    if (bVar2) break;
    tok = this->lexer->currentToken;
    if (cVar5 == '\0') {
      local_d8._0_8_ = &tok;
      local_d8._16_8_ =
           _TERMINATE_MOD_TOKEN.
           super__Vector_base<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>._M_impl.
           super__Vector_impl_data._M_finish;
      lVar9 = (long)_TERMINATE_MOD_TOKEN.
                    super__Vector_base<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)_TERMINATE_MOD_TOKEN.
                    super__Vector_base<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      __it._M_current =
           _TERMINATE_MOD_TOKEN.
           super__Vector_base<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>._M_impl.
           super__Vector_impl_data._M_start;
      for (lVar8 = lVar9 >> 3; _Var10._M_current = __it._M_current, 0 < lVar8; lVar8 = lVar8 + -1) {
        bVar2 = __gnu_cxx::__ops::_Iter_pred<pfederc::Parser::parseModBody(bool)::$_0>::operator()
                          ((_Iter_pred<pfederc::Parser::parseModBody(bool)::__0> *)local_d8,__it);
        if (bVar2) goto LAB_00114f27;
        bVar2 = __gnu_cxx::__ops::_Iter_pred<pfederc::Parser::parseModBody(bool)::$_0>::operator()
                          ((_Iter_pred<pfederc::Parser::parseModBody(bool)::__0> *)local_d8,
                           (__normal_iterator<const_pfederc::TokenType_*,_std::vector<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>_>
                            )(__it._M_current + 1));
        _Var10._M_current = __it._M_current + 1;
        if (bVar2) goto LAB_00114f27;
        bVar2 = __gnu_cxx::__ops::_Iter_pred<pfederc::Parser::parseModBody(bool)::$_0>::operator()
                          ((_Iter_pred<pfederc::Parser::parseModBody(bool)::__0> *)local_d8,
                           (__normal_iterator<const_pfederc::TokenType_*,_std::vector<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>_>
                            )(__it._M_current + 2));
        _Var10._M_current = __it._M_current + 2;
        if (bVar2) goto LAB_00114f27;
        bVar2 = __gnu_cxx::__ops::_Iter_pred<pfederc::Parser::parseModBody(bool)::$_0>::operator()
                          ((_Iter_pred<pfederc::Parser::parseModBody(bool)::__0> *)local_d8,
                           (__normal_iterator<const_pfederc::TokenType_*,_std::vector<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>_>
                            )(__it._M_current + 3));
        _Var10._M_current = __it._M_current + 3;
        if (bVar2) goto LAB_00114f27;
        __it._M_current = __it._M_current + 4;
        lVar9 = lVar9 + -8;
      }
      lVar9 = lVar9 >> 1;
      if (lVar9 == 1) {
        uVar6 = (ulong)(uint)local_e6._2_4_;
LAB_001152c3:
        bVar2 = __gnu_cxx::__ops::_Iter_pred<pfederc::Parser::parseModBody(bool)::$_0>::operator()
                          ((_Iter_pred<pfederc::Parser::parseModBody(bool)::__0> *)local_d8,__it);
        if (!bVar2) {
          __it._M_current = (TokenType *)local_d8._16_8_;
        }
LAB_00114f34:
        cVar5 = (char)uVar6;
        if (__it._M_current != (TokenType *)local_d8._16_8_) break;
      }
      else {
        if (lVar9 == 2) {
LAB_001152a0:
          bVar2 = __gnu_cxx::__ops::_Iter_pred<pfederc::Parser::parseModBody(bool)::$_0>::operator()
                            ((_Iter_pred<pfederc::Parser::parseModBody(bool)::__0> *)local_d8,__it);
          uVar6 = (ulong)(uint)local_e6._2_4_;
          if (!bVar2) {
            __it._M_current = __it._M_current + 1;
            goto LAB_001152c3;
          }
          goto LAB_00114f34;
        }
        if (lVar9 == 3) {
          bVar2 = __gnu_cxx::__ops::_Iter_pred<pfederc::Parser::parseModBody(bool)::$_0>::operator()
                            ((_Iter_pred<pfederc::Parser::parseModBody(bool)::__0> *)local_d8,__it);
          if (!bVar2) {
            __it._M_current = __it._M_current + 1;
            goto LAB_001152a0;
          }
LAB_00114f27:
          uVar6 = (ulong)(uint)local_e6._2_4_;
          __it._M_current = _Var10._M_current;
          goto LAB_00114f34;
        }
        uVar6 = (ulong)(uint)local_e6._2_4_;
      }
      parseExpression((Parser *)local_d8,(Precedence)this);
LAB_00114f52:
      bVar2 = Token::operator!=(this->lexer->currentToken,TOK_EOL);
      if (!bVar2) goto LAB_00114faa;
      if ((char)uVar6 == '\0') {
        local_e6._0_2_ = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
        local_e0._0_4_ = 0xf;
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)(local_d8 + 8),(SyntaxErrorCode *)local_e6,(Position *)local_e0);
        pPVar11 = (Parser *)(local_48 + 8);
      }
      else {
        local_e6._0_2_ = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
        local_e0._0_4_ = 0x11;
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)(local_d8 + 8),(SyntaxErrorCode *)local_e6,(Position *)local_e0);
        pPVar11 = (Parser *)&stack0xffffffffffffffc8;
      }
      generateError(pPVar11,(unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                             *)this);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)pPVar11
                );
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_d8 + 8));
      err = true;
      skipToStmtEol(this);
      uVar6 = (ulong)(uint)local_e6._2_4_;
    }
    else {
      parseExpression((Parser *)local_d8,(Precedence)this);
      bVar2 = Token::operator!=(this->lexer->currentToken,TOK_EOF);
      if ((bVar2 | local_e0[7]) == 1) goto LAB_00114f52;
LAB_00114faa:
      bVar2 = Token::operator==(this->lexer->currentToken,TOK_EOL);
      if (bVar2) {
        Lexer::next(this->lexer);
      }
    }
    if ((Expr *)local_d8._0_8_ != (Expr *)0x0) {
      if ((char)uVar6 == '\0') {
        lVar8 = (long)_ALLOWED_EXPR_MOD.
                      super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)_ALLOWED_EXPR_MOD.
                      super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        pEVar3 = _ALLOWED_EXPR_MOD.
                 super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar9 = lVar8 >> 4;
            pEVar4 = _ALLOWED_EXPR_MOD.
                     super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>.
                     _M_impl.super__Vector_impl_data._M_finish, 0 < lVar9; lVar9 = lVar9 + -1) {
          EVar7 = *(ExprType *)&(((string *)(local_d8._0_8_ + 0x18))->_M_dataplus)._M_p;
          if (EVar7 == *pEVar3) goto LAB_0011512e;
          if (EVar7 == pEVar3[1]) goto LAB_001150fe;
          if (EVar7 == pEVar3[2]) goto LAB_00115104;
          if (EVar7 == pEVar3[3]) goto LAB_0011510a;
          pEVar3 = pEVar3 + 4;
          lVar8 = lVar8 + -0x10;
        }
      }
      else {
        lVar8 = (long)_ALLOWED_EXPR_PROG.
                      super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)_ALLOWED_EXPR_PROG.
                      super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        pEVar3 = _ALLOWED_EXPR_PROG.
                 super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar9 = lVar8 >> 4;
            pEVar4 = _ALLOWED_EXPR_PROG.
                     super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>.
                     _M_impl.super__Vector_impl_data._M_finish, 0 < lVar9; lVar9 = lVar9 + -1) {
          EVar7 = *(ExprType *)&(((string *)(local_d8._0_8_ + 0x18))->_M_dataplus)._M_p;
          if (EVar7 == *pEVar3) goto LAB_0011512e;
          if (EVar7 == pEVar3[1]) goto LAB_001150fe;
          if (EVar7 == pEVar3[2]) goto LAB_00115104;
          if (EVar7 == pEVar3[3]) goto LAB_0011510a;
          pEVar3 = pEVar3 + 4;
          lVar8 = lVar8 + -0x10;
        }
      }
      lVar8 = lVar8 >> 2;
      if (lVar8 == 3) {
        EVar7 = *(ExprType *)&(((string *)(local_d8._0_8_ + 0x18))->_M_dataplus)._M_p;
        if (EVar7 != *pEVar3) {
          pEVar3 = pEVar3 + 1;
          goto LAB_00115120;
        }
        goto LAB_0011512e;
      }
      if (lVar8 == 2) {
        EVar7 = *(ExprType *)&(((string *)(local_d8._0_8_ + 0x18))->_M_dataplus)._M_p;
LAB_00115120:
        if (EVar7 != *pEVar3) {
          pEVar3 = pEVar3 + 1;
          goto LAB_00115128;
        }
        goto LAB_0011512e;
      }
      if (lVar8 == 1) {
        EVar7 = *(ExprType *)&(((string *)(local_d8._0_8_ + 0x18))->_M_dataplus)._M_p;
LAB_00115128:
        if (EVar7 != *pEVar3) {
          pEVar3 = pEVar4;
        }
        goto LAB_0011512e;
      }
      goto LAB_00115133;
    }
  }
  if ((cVar5 != '\0') && (bVar2 = Token::operator!=(this->lexer->currentToken,TOK_EOF), bVar2)) {
    local_d8._8_2_ = 2;
    tok = (Token *)CONCAT44(tok._4_4_,0x10);
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)local_d8,(SyntaxErrorCode *)(local_d8 + 8),(Position *)&tok);
    generateError((Parser *)&stack0xffffffffffffffa8,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffa8);
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)local_d8);
    err = true;
  }
  _Var1._M_p = local_a0._M_p;
  std::
  tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
  ::
  tuple<const_pfederc::Token_*&,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool_&,_true,_true>
            ((tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
              *)local_a0._M_p,&progName,&imports,&defs,&err);
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::~vector(&defs);
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::~vector(&imports);
  return (ModBody *)(_Base_ptr)_Var1._M_p;
LAB_001150fe:
  pEVar3 = pEVar3 + 1;
  goto LAB_0011512e;
LAB_00115104:
  pEVar3 = pEVar3 + 2;
  goto LAB_0011512e;
LAB_0011510a:
  pEVar3 = pEVar3 + 3;
LAB_0011512e:
  if (pEVar3 == pEVar4) {
LAB_00115133:
    bVar2 = isBiOpExpr((Expr *)local_d8._0_8_,TOK_OP_ASG_DCL);
    if (bVar2) goto LAB_00115147;
    bVar2 = isBiOpExpr((Expr *)local_d8._0_8_,TOK_OP_ASG);
    if (bVar2) {
      if (*(Token **)local_d8._0_8_ != local_b0) goto LAB_001153a5;
      bVar2 = isBiOpExpr((Expr *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)(local_d8._0_8_ + 0x48))->_M_allocated_capacity,TOK_OP_DCL);
      if (bVar2) goto LAB_00115147;
    }
    local_e6._0_2_ = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
    local_e0._0_4_ = 0x12;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)(local_d8 + 8),(SyntaxErrorCode *)local_e6,(Position *)local_e0);
    pPVar11 = (Parser *)local_48;
LAB_00115221:
    generateError(pPVar11,(unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)this);
    uVar6 = (ulong)(uint)local_e6._2_4_;
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)pPVar11);
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)(local_d8 + 8));
    err = true;
  }
  else {
LAB_00115147:
    EVar7 = *(ExprType *)&(((string *)(local_d8._0_8_ + 0x18))->_M_dataplus)._M_p;
    this_00 = (vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
               *)&imports;
    if (EVar7 != EXPR_USE) {
      if (EVar7 == EXPR_PROGNAME) {
        if (progName == (Token *)0x0) {
          if ((Token *)*(_func_int ***)local_d8._0_8_ != local_a8) {
LAB_001153a5:
            __cxa_bad_cast();
          }
          progName = (Token *)((Expr *)(local_d8._0_8_ + 0x38))->_vptr_Expr;
          goto LAB_00115269;
        }
        local_e6._0_2_ = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
        local_e0._0_4_ = 0x14;
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)(local_d8 + 8),(SyntaxErrorCode *)local_e6,(Position *)local_e0);
        pPVar11 = (Parser *)&stack0xffffffffffffffb0;
        goto LAB_00115221;
      }
      this_00 = (vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
                 *)&defs;
    }
    std::
    vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
    ::emplace_back<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
              (this_00,(unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_d8);
  }
LAB_00115269:
  if ((Lexer *)local_d8._0_8_ != (Lexer *)0x0) {
    (*(code *)((Token *)*(_func_int ***)local_d8._0_8_)->last)();
  }
  goto LAB_00114dd7;
}

Assistant:

ModBody Parser::parseModBody(bool isprog) noexcept {
  const Token *progName{nullptr};
  Exprs imports;
  Exprs defs;

  bool err = false;

  while(*lexer.getCurrentToken() != TokenType::TOK_EOL) {
    while (*lexer.getCurrentToken() == TokenType::TOK_EOL)
      lexer.next(); // eat eols
    if (*lexer.getCurrentToken() == TokenType::TOK_EOF)
      break;

    const Token *tok = lexer.getCurrentToken();

    // terminate module on termination token
    if (!isprog && std::any_of(
        _TERMINATE_MOD_TOKEN.begin(), _TERMINATE_MOD_TOKEN.end(),
        [&tok](TokenType type) { return *tok == type; }))
      break;

    std::unique_ptr<Expr> expr(parseExpression());
    if (((isprog && *lexer.getCurrentToken() != TokenType::TOK_EOF)
        || !isprog)
        && *lexer.getCurrentToken() != TokenType::TOK_EOL) {
      if (isprog)
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOF_EOL, lexer.getCurrentToken()->getPosition()));
      else
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      err = true;

      skipToStmtEol();
    } else if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next(); // eat eol
    }

    if (expr) {
      const bool validexpr = (isprog ?
        std::any_of(_ALLOWED_EXPR_PROG.begin(), _ALLOWED_EXPR_PROG.end(),
          [&expr](ExprType type) { return expr->getType() == type; }) :
        std::any_of(_ALLOWED_EXPR_MOD.begin(), _ALLOWED_EXPR_MOD.end(),
          [&expr](ExprType type) { return expr->getType() == type; })) ||
      // valid global assignments
        isBiOpExpr(*expr, TokenType::TOK_OP_ASG_DCL) ||
        (isBiOpExpr(*expr, TokenType::TOK_OP_ASG) &&
        isBiOpExpr(dynamic_cast<BiOpExpr&>(*expr).getLeft(), TokenType::TOK_OP_DCL));

      if (!validexpr) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_EXPR, expr->getPosition()));
        err = true;
        continue;
      }

      switch (expr->getType()) {
      case ExprType::EXPR_PROGNAME:
        if (progName) {
          generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            SyntaxErrorCode::STX_ERR_PROGNAME, expr->getPosition()));
          err = true;
        } else
          progName = dynamic_cast<ProgNameExpr&>(*expr).getTokenPtr();

        break;
      case ExprType::EXPR_USE:
        imports.push_back(std::move(expr));
        break;
      default:
        defs.push_back(std::move(expr));
        break;
      }
    }
  }

  if (isprog && *lexer.getCurrentToken() != TokenType::TOK_EOF) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_EOF, lexer.getCurrentToken()->getPosition()));
    err = true;
  }

  return ModBody(progName, std::move(imports), std::move(defs), err);
}